

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O3

void __thiscall
capnp::
CallContext<capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyParams,_capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyResults>
::setPipeline(CallContext<capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyParams,_capnproto_test::capnp::test::TestPipeline::GetCapPipelineOnlyResults>
              *this,Pipeline *pipeline)

{
  CallContextHook *pCVar1;
  PipelineHook *pPVar2;
  undefined4 local_18;
  undefined4 uStack_14;
  PipelineHook *pPStack_10;
  
  pCVar1 = this->hook;
  local_18 = *(undefined4 *)&(pipeline->_typeless).hook.disposer;
  uStack_14 = *(undefined4 *)((long)&(pipeline->_typeless).hook.disposer + 4);
  pPStack_10 = (pipeline->_typeless).hook.ptr;
  (pipeline->_typeless).hook.ptr = (PipelineHook *)0x0;
  (*pCVar1->_vptr_CallContextHook[4])(pCVar1,&local_18);
  pPVar2 = pPStack_10;
  if (pPStack_10 != (PipelineHook *)0x0) {
    pPStack_10 = (PipelineHook *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(uStack_14,local_18))
              ((undefined8 *)CONCAT44(uStack_14,local_18),
               pPVar2->_vptr_PipelineHook[-2] + (long)&pPVar2->_vptr_PipelineHook);
  }
  return;
}

Assistant:

void CallContext<Params, Results>::setPipeline(typename Results::Pipeline&& pipeline) {
  hook->setPipeline(PipelineHook::from(kj::mv(pipeline)));
}